

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynNamespaceDefinition * ParseNamespaceDefinition(ParseContext *ctx)

{
  Lexeme *begin;
  SynNamespaceElement *pSVar1;
  SynIdentifier *pSVar2;
  SynIdentifier *pSVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Lexeme *pLVar6;
  Lexeme *pLVar7;
  undefined4 extraout_var_00;
  SynNamespaceDefinition *this;
  IntrusiveList<SynIdentifier> *pIVar8;
  InplaceStr IVar9;
  IntrusiveList<SynBase> IVar10;
  IntrusiveList<SynIdentifier> path;
  undefined4 extraout_var_01;
  
  pIVar8 = &path;
  begin = ctx->currentLexeme;
  if (begin->type == lex_namespace) {
    ctx->currentLexeme = begin + 1;
    path.head = (SynIdentifier *)0x0;
    path.tail = (SynIdentifier *)0x0;
    bVar4 = anon_unknown.dwarf_153727::CheckAt(ctx,lex_string,"ERROR: namespace name required");
    if (bVar4) {
      IVar9 = ParseContext::Consume(ctx);
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pLVar6 = ParseContext::Previous(ctx);
      pLVar7 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier
                ((SynIdentifier *)CONCAT44(extraout_var,iVar5),pLVar6,pLVar7,IVar9);
      IntrusiveList<SynIdentifier>::push_back(&path,(SynIdentifier *)CONCAT44(extraout_var,iVar5));
    }
    while (ctx->currentLexeme->type == lex_point) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      bVar4 = anon_unknown.dwarf_153727::CheckAt
                        (ctx,lex_string,"ERROR: namespace name required after \'.\'");
      if (!bVar4) break;
      IVar9 = ParseContext::Consume(ctx);
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pLVar6 = ParseContext::Previous(ctx);
      pLVar7 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier
                ((SynIdentifier *)CONCAT44(extraout_var_00,iVar5),pLVar6,pLVar7,IVar9);
      IntrusiveList<SynIdentifier>::push_back
                (&path,(SynIdentifier *)CONCAT44(extraout_var_00,iVar5));
    }
    anon_unknown.dwarf_153727::CheckConsume
              (ctx,lex_ofigure,"ERROR: \'{\' not found after namespace name");
    pSVar1 = ctx->currentNamespace;
    while (pSVar2 = pIVar8->head, pSVar2 != (SynIdentifier *)0x0) {
      ParseContext::PushNamespace(ctx,pSVar2);
      pIVar8 = (IntrusiveList<SynIdentifier> *)&(pSVar2->super_SynBase).next;
    }
    IVar10 = ParseExpressions(ctx);
    ctx->currentNamespace = pSVar1;
    anon_unknown.dwarf_153727::CheckConsume
              (ctx,lex_cfigure,"ERROR: \'}\' not found after namespace body");
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this = (SynNamespaceDefinition *)CONCAT44(extraout_var_01,iVar5);
    pLVar6 = ParseContext::Previous(ctx);
    pSVar3 = path.tail;
    pSVar2 = path.head;
    SynBase::SynBase((SynBase *)this,0x41,begin,pLVar6);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e4ce8;
    (this->path).head = pSVar2;
    (this->path).tail = pSVar3;
    this->expressions = IVar10;
  }
  else {
    this = (SynNamespaceDefinition *)0x0;
  }
  return this;
}

Assistant:

SynNamespaceDefinition* ParseNamespaceDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_namespace))
	{
		IntrusiveList<SynIdentifier> path;

		if(CheckAt(ctx, lex_string, "ERROR: namespace name required"))
		{
			InplaceStr value = ctx.Consume();
			path.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), value));
		}

		while(ctx.Consume(lex_point))
		{
			if(!CheckAt(ctx, lex_string, "ERROR: namespace name required after '.'"))
				break;

			InplaceStr value = ctx.Consume();
			path.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), value));
		}

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after namespace name");

		SynNamespaceElement *currentNamespace = ctx.currentNamespace;

		for(SynIdentifier *el = path.head; el; el = (SynIdentifier*)el->next)
			ctx.PushNamespace(el);

		IntrusiveList<SynBase> code = ParseExpressions(ctx);

		ctx.currentNamespace = currentNamespace;

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after namespace body");

		return new (ctx.get<SynNamespaceDefinition>()) SynNamespaceDefinition(start, ctx.Previous(), path, code);
	}

	return NULL;
}